

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O1

UChar * __thiscall icu_63::LocDataParser::nextString(LocDataParser *this)

{
  char16_t cVar1;
  char16_t cVar2;
  char16_t cVar3;
  char16_t cVar4;
  char16_t *pcVar5;
  UBool UVar6;
  UChar *pUVar7;
  char16_t *pcVar8;
  UChar UVar9;
  char *in_RSI;
  char16_t *pcVar10;
  
  pUVar7 = this->p;
  if (pUVar7 < this->e) {
    do {
      UVar9 = this->ch;
      if (UVar9 == L'\xffff') {
        UVar9 = *pUVar7;
      }
      UVar6 = PatternProps::isWhiteSpace((uint)(ushort)UVar9);
      if (UVar6 == '\0') break;
      pUVar7 = this->p + 1;
      this->p = pUVar7;
      this->ch = L'\xffff';
    } while (pUVar7 < this->e);
  }
  pcVar10 = this->p;
  if (pcVar10 < this->e) {
    cVar1 = *pcVar10;
    if ((cVar1 == L'\'') || (cVar1 == L'\"')) {
      this->p = pcVar10 + 1;
      this->ch = L'\xffff';
      pcVar10 = L"\'";
      if (cVar1 == L'\"') {
        pcVar10 = L"\"";
      }
    }
    else {
      pcVar10 = L" ,><\'\"";
    }
    pcVar5 = this->p;
    if (pcVar5 < this->e) {
      cVar2 = *pcVar10;
      pcVar8 = pcVar5;
      do {
        cVar3 = *pcVar8;
        pcVar8 = pcVar10;
        if ((cVar2 == L' ') &&
           (UVar6 = PatternProps::isWhiteSpace((uint)(ushort)cVar3), UVar6 != '\0')) break;
        do {
          cVar4 = *pcVar8;
          if (cVar4 == L'\0') break;
          pcVar8 = pcVar8 + 1;
        } while (cVar4 != cVar3);
        if (cVar4 == cVar3) break;
        pcVar8 = this->p + 1;
        this->p = pcVar8;
      } while (pcVar8 < this->e);
    }
    pcVar10 = this->p;
    if (pcVar10 != this->e) {
      cVar2 = *pcVar10;
      if (pcVar5 < pcVar10) {
        this->ch = cVar2;
        *pcVar10 = L'\0';
        pcVar8 = pcVar5;
      }
      else {
        pcVar8 = (char16_t *)0x0;
      }
      if ((cVar1 == L'\'') || (cVar1 == L'\"')) {
        if ((cVar2 == cVar1) && (pcVar10 != pcVar5)) {
          this->p = pcVar10 + 1;
          this->ch = L'\xffff';
          return pcVar8;
        }
      }
      else {
        if (0x3c < (ushort)cVar2) {
          return pcVar8;
        }
        if ((0x1000008400000000U >> ((ulong)(uint)(ushort)cVar2 & 0x3f) & 1) == 0) {
          return pcVar8;
        }
      }
    }
    parseError(this,in_RSI);
  }
  return (UChar *)0x0;
}

Assistant:

UChar*
LocDataParser::nextString() {
    UChar* result = NULL;
    
    skipWhitespace();
    if (p < e) {
        const UChar* terminators;
        UChar c = *p;
        UBool haveQuote = c == QUOTE || c == TICK;
        if (haveQuote) {
            inc();
            terminators = c == QUOTE ? DQUOTE_STOPLIST : SQUOTE_STOPLIST;
        } else {
            terminators = NOQUOTE_STOPLIST;
        }
        UChar* start = p;
        while (p < e && !inList(*p, terminators)) ++p;
        if (p == e) {
            ERROR("Unexpected end of data");
        }
        
        UChar x = *p;
        if (p > start) {
            ch = x;
            *p = 0x0; // terminate by writing to data
            result = start; // just point into data
        }
        if (haveQuote) {
            if (x != c) {
                ERROR("Missing matching quote");
            } else if (p == start) {
                ERROR("Empty string");
            }
            inc();
        } else if (x == OPEN_ANGLE || x == TICK || x == QUOTE) {
            ERROR("Unexpected character in string");
        }
    }

    // ok for there to be no next string
    return result;
}